

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestSkipOnSetupFail::Run(TestSkipOnSetupFail *this)

{
  int iVar1;
  long lVar2;
  Results rs;
  TestSkipOnSetupFailInternal myTestA;
  ostringstream oss;
  TestRegistry r;
  string local_1658;
  Results local_1638;
  Test local_1620;
  ostringstream local_15e0 [376];
  TestRegistry local_1468;
  
  testinator::TestRegistry::TestRegistry(&local_1468);
  std::__cxx11::ostringstream::ostringstream(local_15e0);
  std::make_unique<testinator::TAPOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1620
            );
  std::__cxx11::string::string((string *)&local_1658,"A",(allocator *)&local_1638);
  TestSkipOnSetupFailInternal::TestSkipOnSetupFailInternal
            ((TestSkipOnSetupFailInternal *)&local_1620,&local_1468,&local_1658);
  std::__cxx11::string::~string((string *)&local_1658);
  local_1658._M_dataplus._M_p = (pointer)0x0;
  local_1658._M_string_length = 100;
  local_1658.field_2._M_allocated_capacity = 0;
  testinator::TestRegistry::RunAllTests
            (&local_1638,&local_1468,(RunParams *)&local_1658,(Outputter *)local_1620._vptr_Test);
  if (Run()::expected_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&Run()::expected_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&Run()::expected_abi_cxx11_,"A # skip",(allocator *)&local_1658);
      __cxa_atexit(std::__cxx11::string::~string,&Run()::expected_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&Run()::expected_abi_cxx11_);
    }
  }
  std::__cxx11::stringbuf::str();
  lVar2 = std::__cxx11::string::find((string *)&local_1658,0x17bb20);
  std::__cxx11::string::~string((string *)&local_1658);
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector(&local_1638);
  testinator::Test::~Test(&local_1620);
  if ((Outputter *)local_1620._vptr_Test != (Outputter *)0x0) {
    (*(*(_func_int ***)local_1620._vptr_Test)[8])(local_1620._vptr_Test);
  }
  std::__cxx11::ostringstream::~ostringstream(local_15e0);
  testinator::TestRegistry::~TestRegistry(&local_1468);
  return lVar2 != -1;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::TAPOutputter>(oss);

    TestSkipOnSetupFailInternal myTestA(r, "A");
    testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

    static string expected = "A # skip";
    return oss.str().find(expected) != string::npos;
  }